

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::FullUncertaintyWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  _Rb_tree_header *p_Var1;
  pointer pmVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  int *piVar5;
  _Base_ptr p_Var6;
  vector<lossval,std::allocator<lossval>> *pvVar7;
  _Base_ptr p_Var8;
  code *pcVar9;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  undefined4 in_register_0000000c;
  _Rb_tree_header *p_Var13;
  _Rb_tree_header *p_Var14;
  long *plVar15;
  int *piVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_double>_>,_std::_Rb_tree_iterator<std::pair<const_int,_double>_>_>
  pVar17;
  int in_stack_00000008;
  pair<const_outkey2,_OutLosses> x;
  undefined4 uStack_f4;
  pair<const_outkey2,_OutLosses> x_1;
  lossval lv;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  items;
  
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &items._M_t._M_impl.super__Rb_tree_header._M_header;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree(&unusedperiodstoweighting._M_t,&(this->periodstoweighting_)._M_t);
  pmVar2 = (this->out_loss_->
           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var8 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
  p_Var10 = &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != p_Var10) {
    plVar15 = (long *)((long)&x.second.agg_out_loss + CONCAT44(in_register_0000000c,epcalc));
    p_Var1 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
    do {
      x.second.max_out_loss = *(OASIS_FLOAT *)&p_Var8[1]._M_left;
      x.first.summary_id = p_Var8[1]._M_color;
      x.first.period_no = *(int *)&p_Var8[1].field_0x4;
      x._8_8_ = p_Var8[1]._M_parent;
      pcVar9 = (code *)GetOutLoss;
      if ((GetOutLoss & 1) != 0) {
        pcVar9 = *(code **)(*plVar15 + -1 + GetOutLoss);
      }
      lv.value = (OASIS_FLOAT)(*pcVar9)(plVar15);
      p_Var3 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < x.first.period_no]) {
        if (x.first.period_no <= (int)*(size_t *)(p_Var3 + 1)) {
          p_Var6 = p_Var3;
        }
      }
      p_Var13 = p_Var1;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var13 = (_Rb_tree_header *)p_Var6,
         x.first.period_no < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
        p_Var13 = p_Var1;
      }
      if (p_Var13 != p_Var1) {
        lv.period_weighting = *(double *)(p_Var13 + 1);
        lv.period_no = x.first.period_no;
        pvVar7 = (vector<lossval,std::allocator<lossval>> *)
                 std::
                 map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                 ::operator[](&items,(key_type *)&x);
        iVar4._M_current = *(lossval **)(pvVar7 + 8);
        if (iVar4._M_current == *(lossval **)(pvVar7 + 0x10)) {
          std::vector<lossval,std::allocator<lossval>>::_M_realloc_insert<lossval_const&>
                    (pvVar7,iVar4,&lv);
        }
        else {
          *(ulong *)&(iVar4._M_current)->value = CONCAT44(lv._20_4_,lv.value);
          *(ulong *)iVar4._M_current = CONCAT44(lv._4_4_,lv.period_no);
          (iVar4._M_current)->period_weighting = lv.period_weighting;
          *(long *)(pvVar7 + 8) = *(long *)(pvVar7 + 8) + 0x18;
        }
      }
      pVar17 = std::
               _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::equal_range(&unusedperiodstoweighting._M_t,&x.first.period_no);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::_M_erase_aux(&unusedperiodstoweighting._M_t,(_Base_ptr)pVar17.first._M_node,
                     (_Base_ptr)pVar17.second._M_node);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != p_Var10);
  }
  WriteExceedanceProbabilityTable
            (this,fileIDs,&items,1.0,eptype,eptype_tvar,in_stack_00000008,&unusedperiodstoweighting,
             1);
  if ((this->ordFlag_ == false) &&
     ((this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var12 = (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      plVar15 = (long *)((long)&x_1.second.agg_out_loss + CONCAT44(in_register_0000000c,epcalc));
      p_Var13 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
      do {
        lv.period_no = p_Var12[1]._M_color;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&lv.period_weighting,
                   (vector<int,_std::allocator<int>_> *)&p_Var12[1]._M_parent);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
        ::clear(&items._M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::operator=(&unusedperiodstoweighting._M_t,&(this->periodstoweighting_)._M_t);
        pmVar2 = (this->out_loss_->
                 super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        p_Var11 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
        piVar16 = (int *)lv.period_weighting;
        while (lv.period_weighting = (double)piVar16,
              p_Var11 != &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header) {
          x_1.second.max_out_loss = *(OASIS_FLOAT *)&p_Var11[1]._M_left;
          x_1.first.summary_id = p_Var11[1]._M_color;
          x_1.first.period_no = *(int *)&p_Var11[1].field_0x4;
          x_1.first.sidx = *(int *)&p_Var11[1]._M_parent;
          x_1.second.agg_out_loss = *(OASIS_FLOAT *)((long)&p_Var11[1]._M_parent + 4);
          piVar5 = (int *)CONCAT44(lv._20_4_,lv.value);
          for (; piVar16 != piVar5; piVar16 = piVar16 + 1) {
            if (x_1.first.sidx == *piVar16) {
              pcVar9 = (code *)GetOutLoss;
              if ((GetOutLoss & 1) != 0) {
                pcVar9 = *(code **)(*plVar15 + -1 + GetOutLoss);
              }
              x.second.max_out_loss = (OASIS_FLOAT)(*pcVar9)(plVar15);
              p_Var8 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent;
              p_Var10 = &p_Var13->_M_header;
              for (; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
                  p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < x_1.first.period_no]) {
                if (x_1.first.period_no <= (int)*(size_t *)(p_Var8 + 1)) {
                  p_Var10 = p_Var8;
                }
              }
              p_Var14 = p_Var13;
              if (((_Rb_tree_header *)p_Var10 != p_Var13) &&
                 (p_Var14 = (_Rb_tree_header *)p_Var10,
                 x_1.first.period_no < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
                p_Var14 = p_Var13;
              }
              if (p_Var14 != p_Var13) {
                x._8_8_ = *(undefined8 *)(p_Var14 + 1);
                x.first.summary_id = x_1.first.period_no;
                pvVar7 = (vector<lossval,std::allocator<lossval>> *)
                         std::
                         map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                         ::operator[](&items,(key_type *)&x_1);
                iVar4._M_current = *(lossval **)(pvVar7 + 8);
                if (iVar4._M_current == *(lossval **)(pvVar7 + 0x10)) {
                  std::vector<lossval,std::allocator<lossval>>::_M_realloc_insert<lossval_const&>
                            (pvVar7,iVar4,(lossval *)&x);
                }
                else {
                  *(ulong *)&(iVar4._M_current)->value = CONCAT44(uStack_f4,x.second.max_out_loss);
                  *(ulong *)iVar4._M_current = CONCAT44(x.first.period_no,x.first.summary_id);
                  (iVar4._M_current)->period_weighting = (double)x._8_8_;
                  *(long *)(pvVar7 + 8) = *(long *)(pvVar7 + 8) + 0x18;
                }
              }
              pVar17 = std::
                       _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::equal_range(&unusedperiodstoweighting._M_t,&x_1.first.period_no);
              std::
              _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              ::_M_erase_aux(&unusedperiodstoweighting._M_t,(_Base_ptr)pVar17.first._M_node,
                             (_Base_ptr)pVar17.second._M_node);
            }
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
          piVar16 = (int *)lv.period_weighting;
        }
        WriteExceedanceProbabilityTable
                  (this,fileIDs,&items,1.0,eptype,lv.period_no,in_stack_00000008,
                   &unusedperiodstoweighting,1);
        if (lv.period_weighting != 0.0) {
          operator_delete((void *)lv.period_weighting);
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var1);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&unusedperiodstoweighting._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::~_Rb_tree(&items._M_t);
  return;
}

Assistant:

void aggreports::FullUncertaintyWithWeighting(const std::vector<int> &fileIDs,
	OASIS_FLOAT (OutLosses::*GetOutLoss)(), const int epcalc,
	const int eptype, const int eptype_tvar) {

  std::map<int, lossvec2> items;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  for (auto x : (*out_loss_)[SAMPLES]) {
    lossval lv;
    lv.value = (x.second.*GetOutLoss)();
    auto iter = periodstoweighting_.find(x.first.period_no);
    if (iter != periodstoweighting_.end()) {
      lv.period_weighting = iter->second;
      lv.period_no = x.first.period_no;   // for debugging
      items[x.first.summary_id].push_back(lv);
    }
    unusedperiodstoweighting.erase(x.first.period_no);
  }

  WriteExceedanceProbabilityTable(fileIDs, items, 1, epcalc, eptype,
				  eptype_tvar, unusedperiodstoweighting);

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      items.clear();
      unusedperiodstoweighting = periodstoweighting_;
      for (auto x : (*out_loss_)[SAMPLES]) {
	for (auto sidx : ensemble.second) {
	  if (x.first.sidx == sidx) {
	    lossval lv;
	    lv.value = (x.second.*GetOutLoss)();
	    auto iter = periodstoweighting_.find(x.first.period_no);
	    if (iter != periodstoweighting_.end()) {
	      lv.period_weighting = iter->second;
	      lv.period_no = x.first.period_no;   // for debugging
	      items[x.first.summary_id].push_back(lv);
	    }
	    unusedperiodstoweighting.erase(x.first.period_no);
	  }
	}
      }
      // EPType doubles as ensemble ID for legacy output
      WriteExceedanceProbabilityTable(fileIDs, items, 1, epcalc, ensemble.first,
				      eptype_tvar, unusedperiodstoweighting, 1);
    }
  }

}